

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  short sVar8;
  
  pIVar4 = GImGui;
  if (window->RootWindow != window) {
    __assert_fail("window == window->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x190a,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
  }
  uVar6 = (uint)window->FocusOrder;
  if (-1 < window->FocusOrder) {
    uVar1 = (GImGui->WindowsFocusOrder).Size;
    if ((int)uVar6 < (int)uVar1) {
      ppIVar2 = (GImGui->WindowsFocusOrder).Data;
      if (ppIVar2[uVar6] != window) {
        __assert_fail("g.WindowsFocusOrder[cur_order] == window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0x190d,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
      }
      if ((int)uVar1 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x695,"T &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
      }
      if (ppIVar2[(ulong)uVar1 - 1] != window) {
        uVar7 = uVar1 - 1;
        uVar5 = (ulong)uVar6 - 1;
        while ((int)uVar6 < (int)uVar7) {
          if (((pIVar4->WindowsFocusOrder).Size <= (int)(uVar6 + 1)) ||
             (ppIVar2 = (pIVar4->WindowsFocusOrder).Data, ppIVar2[uVar5 + 1] = ppIVar2[uVar5 + 2],
             (pIVar4->WindowsFocusOrder).Size <= (int)uVar6)) goto LAB_0014ed20;
          pIVar3 = (pIVar4->WindowsFocusOrder).Data[uVar5 + 1];
          sVar8 = (short)*(undefined4 *)&pIVar3->FocusOrder + -1;
          pIVar3->FocusOrder = sVar8;
          if ((pIVar4->WindowsFocusOrder).Size <= (int)uVar6) goto LAB_0014ed20;
          uVar5 = uVar5 + 1;
          uVar6 = uVar6 + 1;
          if (uVar5 != (uint)(int)sVar8) {
            __assert_fail("g.WindowsFocusOrder[n]->FocusOrder == n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                          ,0x1916,"void ImGui::BringWindowToFocusFront(ImGuiWindow *)");
          }
        }
        if ((pIVar4->WindowsFocusOrder).Size < (int)uVar1) goto LAB_0014ed20;
        (pIVar4->WindowsFocusOrder).Data[uVar7] = window;
        window->FocusOrder = (short)uVar7;
      }
      return;
    }
  }
LAB_0014ed20:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}